

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnRight(OptimizeInstructions *this,Binary *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Id IVar3;
  Type type;
  Expression *pEVar4;
  Table *pTVar5;
  Export *left_00;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  matcher;
  undefined1 auVar6 [40];
  undefined1 auVar7 [40];
  undefined1 auVar8 [40];
  undefined1 auVar9 [40];
  undefined1 auVar10 [40];
  undefined1 auVar11 [40];
  undefined1 auVar12 [40];
  undefined1 auVar13 [40];
  undefined1 auVar14 [40];
  undefined1 auVar15 [40];
  undefined1 auVar16 [40];
  undefined1 auVar17 [40];
  undefined1 auVar18 [40];
  undefined1 auVar19 [40];
  undefined1 auVar20 [40];
  undefined1 auVar21 [40];
  undefined1 auVar22 [40];
  undefined1 auVar23 [40];
  undefined1 auVar24 [40];
  undefined1 auVar25 [40];
  undefined1 auVar26 [40];
  undefined1 auVar27 [40];
  undefined1 auVar28 [40];
  undefined1 auVar29 [40];
  undefined1 auVar30 [40];
  undefined1 auVar31 [40];
  undefined1 auVar32 [40];
  undefined1 auVar33 [40];
  undefined1 auVar34 [40];
  undefined1 auVar35 [40];
  undefined1 auVar36 [40];
  undefined1 auVar37 [40];
  undefined1 auVar38 [40];
  bool bVar39;
  BinaryOp BVar40;
  UnaryOp UVar41;
  BinaryOp BVar42;
  Index IVar43;
  int iVar44;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> casted;
  ulong uVar45;
  Module *pMVar46;
  undefined4 extraout_var;
  PassOptions *options;
  Op OVar47;
  Module *wasm;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  pointer *ppuVar48;
  double dVar49;
  undefined1 auVar50 [16];
  undefined8 uStack_748;
  undefined8 uStack_738;
  undefined8 local_720;
  undefined4 uStack_70c;
  undefined8 local_6f8;
  undefined4 uStack_6e4;
  undefined8 local_6d0;
  undefined4 uStack_6bc;
  undefined8 local_6a8;
  undefined4 uStack_694;
  undefined8 local_680;
  undefined4 uStack_66c;
  undefined8 local_658;
  undefined4 uStack_644;
  undefined8 local_630;
  undefined4 uStack_61c;
  undefined8 local_608;
  undefined4 uStack_5f4;
  undefined8 local_5e0;
  undefined4 uStack_5cc;
  undefined8 local_5b8;
  undefined4 uStack_5a4;
  undefined8 local_590;
  undefined4 uStack_57c;
  undefined8 local_568;
  undefined4 uStack_554;
  undefined8 local_540;
  undefined4 uStack_52c;
  undefined8 local_518;
  undefined4 uStack_504;
  undefined8 local_4f0;
  undefined4 uStack_4dc;
  undefined8 local_4c8;
  undefined4 uStack_4b4;
  undefined8 local_4a0;
  undefined4 uStack_48c;
  undefined8 local_478;
  undefined4 uStack_464;
  undefined8 local_450;
  undefined4 uStack_43c;
  undefined8 local_428;
  undefined4 uStack_414;
  undefined8 local_400;
  undefined4 uStack_3ec;
  undefined8 local_3d8;
  undefined4 uStack_3c4;
  undefined8 local_3b0;
  undefined4 uStack_39c;
  undefined8 local_388;
  undefined4 uStack_374;
  undefined8 local_360;
  undefined4 uStack_34c;
  undefined8 local_338;
  undefined4 uStack_324;
  undefined8 local_310;
  undefined4 uStack_2fc;
  undefined8 local_2e8;
  undefined4 uStack_2d4;
  undefined8 local_2c0;
  undefined4 uStack_2ac;
  undefined8 local_298;
  undefined4 uStack_284;
  undefined8 local_270;
  undefined4 uStack_25c;
  undefined8 local_248;
  undefined4 uStack_234;
  undefined8 local_220;
  undefined4 uStack_20c;
  undefined8 local_1f8;
  undefined1 local_1f0 [8];
  Binary *inner;
  Binary *inner_1;
  undefined1 local_1d8 [8];
  Expression *x;
  anon_union_16_6_1532cd5a_for_Literal_0 local_1c8;
  Type local_1b8;
  pointer pLStack_1b0;
  undefined1 local_190 [8];
  Const *c_1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_180;
  Type local_170;
  pointer pLStack_168;
  undefined1 local_148 [8];
  Expression *x_1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_138;
  Type local_128;
  pointer pCStack_120;
  anon_union_16_6_1532cd5a_for_Literal_0 local_100;
  undefined1 local_f0 [16];
  pointer local_e0;
  pointer pbStack_d8;
  Builder local_b8;
  Builder builder;
  Const *c;
  anon_union_16_6_1532cd5a_for_Literal_0 local_88;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
  local_78;
  Module *local_40;
  HeapType local_38;
  Expression *left;
  
  local_b8.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  pMVar46 = (Module *)curr->right;
  if (*(Id *)&(pMVar46->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != ConstId) {
LAB_009d8ca5:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
  }
  type.id = ((Type *)&(pMVar46->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->id;
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar42 = curr->op, BVar40 = Abstract::getBinary((Type)(curr->left->type).id,Shl),
        BVar42 == BVar40)) {
    local_38.id = (uintptr_t)curr->left;
    if (curr->right->_id == ConstId) {
      Literal::Literal((Literal *)&local_100.func,(Literal *)(curr->right + 1));
      bVar39 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches(&local_78,
                         (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                          *)&local_100.func);
      Literal::~Literal((Literal *)&local_100.func);
      if (bVar39) {
        return (Expression *)local_38.id;
      }
    }
  }
  local_f0._0_8_ = (pointer)0x0;
  local_100.i64 = 0;
  local_e0 = (pointer)0x0;
  pbStack_d8 = (pointer)0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar42 = curr->op, BVar40 = Abstract::getBinary((Type)(curr->left->type).id,ShrU),
        BVar42 == BVar40)) {
    local_38.id = (uintptr_t)curr->left;
    pEVar4 = curr->right;
    if (pEVar4->_id == ConstId) {
      if ((element_type *)local_100.i64 != (element_type *)0x0) {
        ((local_100.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        tag).super_IString.str._M_len = (size_t)pEVar4;
      }
      Literal::Literal((Literal *)&builder,(Literal *)(pEVar4 + 1));
      bVar39 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)local_f0,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar39) {
        return (Expression *)local_38.id;
      }
    }
  }
  local_138.i64 = 0;
  local_148 = (undefined1  [8])0x0;
  local_128.id = 0;
  pCStack_120 = (pointer)0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar42 = curr->op, BVar40 = Abstract::getBinary((Type)(curr->left->type).id,ShrS),
        BVar42 == BVar40)) {
    local_38.id = (uintptr_t)curr->left;
    pTVar5 = (Table *)curr->right;
    if (*(Id *)&(pTVar5->super_Importable).super_Named == ConstId) {
      if (local_148 != (undefined1  [8])0x0) {
        (((_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_> *)
         &(((Name *)local_148)->super_IString).str._M_len)->
        super__Head_base<0UL,_wasm::Table_*,_false>)._M_head_impl = pTVar5;
      }
      Literal::Literal((Literal *)&builder,
                       (Literal *)((long)&(pTVar5->super_Importable).super_Named + 0x10));
      bVar39 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)&local_138.func,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar39) {
        return (Expression *)local_38.id;
      }
    }
  }
  local_180.i64 = 0;
  local_190 = (undefined1  [8])0x0;
  local_170.id = 0;
  pLStack_168 = (pointer)0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar42 = curr->op, BVar40 = Abstract::getBinary((Type)(curr->left->type).id,Or),
        BVar42 == BVar40)) {
    local_38.id = (uintptr_t)curr->left;
    pEVar4 = curr->right;
    if (pEVar4->_id == ConstId) {
      if (local_190 != (undefined1  [8])0x0) {
        (((Name *)local_190)->super_IString).str._M_len = (size_t)pEVar4;
      }
      Literal::Literal((Literal *)&builder,(Literal *)(pEVar4 + 1));
      bVar39 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)&local_180.func,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar39) {
        return (Expression *)local_38.id;
      }
    }
  }
  local_1c8.i64 = 0;
  local_1d8 = (undefined1  [8])0x0;
  local_1b8.id = 0;
  pLStack_1b0 = (pointer)0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar42 = curr->op, BVar40 = Abstract::getBinary((Type)(curr->left->type).id,Xor),
        BVar42 == BVar40)) {
    local_38.id = (uintptr_t)curr->left;
    pEVar4 = curr->right;
    if (pEVar4->_id == ConstId) {
      if (local_1d8 != (undefined1  [8])0x0) {
        (((Name *)local_1d8)->super_IString).str._M_len = (size_t)pEVar4;
      }
      Literal::Literal((Literal *)&builder,(Literal *)(pEVar4 + 1));
      bVar39 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)&local_1c8.func,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar39) {
        return (Expression *)local_38.id;
      }
    }
  }
  local_f0._0_8_ = local_190;
  local_f0._8_8_ = &local_88;
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  local_100.i64 = 0;
  local_100._8_4_ = 5;
  local_190 = (undefined1  [8])&stack0xffffffffffffffc8;
  c_1 = (Const *)this;
  bVar39 = Match::Internal::
           Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
           ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                      *)&local_100.func,
                     (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                      )curr);
  if (bVar39) {
    return (Expression *)pMVar46;
  }
  local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1d8;
  local_f0._0_8_ = (pointer)0x0;
  local_100.i64 = 0;
  local_e0 = (pointer)0x0;
  pbStack_d8 = (pointer)0x0;
  local_148 = (undefined1  [8])0x0;
  x_1 = (Expression *)CONCAT44(x_1._4_4_,0xf);
  local_1d8 = (undefined1  [8])&stack0xffffffffffffffc8;
  x = (Expression *)this;
  local_138.func.super_IString.str._M_str = (char *)&local_100;
  local_40 = pMVar46;
  bVar39 = Match::Internal::
           Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
           ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                      *)local_148,
                     (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                      )curr);
  if (bVar39) {
    return (Expression *)local_40;
  }
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  local_148 = (undefined1  [8])local_1f0;
  x_1 = (Expression *)CONCAT44(x_1._4_4_,4);
  local_138.func.super_IString.str._M_str = local_190;
  local_f0._0_8_ =
       (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
        *)0x0;
  local_e0 = (pointer)0x0;
  local_100.i64 = 0;
  auVar6._4_4_ = uStack_70c;
  auVar6._0_4_ = 5;
  auVar6._8_8_ = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                  *)local_148;
  auVar6._16_8_ = &local_100;
  auVar6._24_8_ = local_6f8;
  auVar6._32_8_ = 0;
  local_190 = (undefined1  [8])&stack0xffffffffffffffc8;
  local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_88;
  bVar39 = Match::
           matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                     ((Expression *)curr,
                      (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                       )(auVar6 << 0x40));
  pMVar46 = local_40;
  if (bVar39) {
    if (((((this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner)->options).shrinkLevel == 0) &&
       (uVar45 = Literal::getInteger((Literal *)
                                     &(local_40->exports).
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage),
       uVar45 - 1 < (uVar45 ^ uVar45 - 1))) {
      curr->left = (Expression *)local_38.id;
      left_00 = (((pointer)((long)local_1f0 + 0x18))->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (*(Id *)&(left_00->name).super_IString == ConstId) {
        pMVar46 = (Module *)
                  Builder::makeBinary(&local_b8,
                                      *(BinaryOp *)
                                       &(((pointer)((long)local_1f0 + 0x10))->_M_t).
                                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                        .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,
                                      (Expression *)left_00,(Expression *)curr);
        return (Expression *)pMVar46;
      }
      goto LAB_009d8ca5;
    }
    ppuVar48 = &(pMVar46->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Literal::neg((Literal *)&local_88.func,(Literal *)ppuVar48);
    Literal::operator=((Literal *)ppuVar48,(Literal *)&local_88.func);
    goto LAB_009d7d6a;
  }
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  auVar7._4_4_ = uStack_6e4;
  auVar7._0_4_ = 0x14;
  auVar7._8_8_ = &local_100;
  auVar7._16_8_ = &local_88;
  auVar7._24_8_ = local_6d0;
  auVar7._32_8_ = 0;
  local_100.i64 = (int64_t)(Module *)&stack0xffffffffffffffc8;
  bVar39 = Match::
           matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                     ((Expression *)curr,
                      (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                       )(auVar7 << 0x40));
  if (bVar39) {
LAB_009d7d25:
    OVar47 = EqZ;
  }
  else {
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 9;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    x_1 = (Expression *)this;
    local_f0._0_8_ =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)local_148;
    local_f0._8_8_ = &local_88;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar39) {
      Literal::makeZero((Literal *)&local_88.func,type);
      pMVar46 = local_40;
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      goto LAB_009d7df4;
    }
    local_1d8 = (undefined1  [8])0x0;
    local_f0._0_8_ = (pointer)0x0;
    local_e0 = (pointer)0x0;
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&builder;
    local_148 = (undefined1  [8])&inner;
    x_1 = (Expression *)CONCAT44(x_1._4_4_,9);
    local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1d8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    auVar8._4_4_ = uStack_6bc;
    auVar8._0_4_ = 0x15;
    auVar8._8_8_ = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                    *)local_148;
    auVar8._16_8_ = &local_88;
    auVar8._24_8_ = local_6a8;
    auVar8._32_8_ = 0;
    local_138.func.super_IString.str._M_str = (char *)&local_100;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar8 << 0x40));
    pMVar46 = local_40;
    if (bVar39) {
      bVar39 = Literal::isSignedMin
                         ((Literal *)
                          &((builder.wasm)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar39) {
LAB_009d7f28:
        BVar42 = Abstract::getBinary((Type)((builder.wasm)->exports).
                                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,And);
        inner->op = BVar42;
        bVar39 = Literal::isSignedMin
                           ((Literal *)
                            &((builder.wasm)->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar39) {
          Literal::makeSignedMax
                    ((Literal *)&local_88.func,
                     (Type)((builder.wasm)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
          Literal::operator=((Literal *)
                             &((builder.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Literal *)&local_88.func);
          this_00 = &local_88;
        }
        else {
          Literal::abs((Literal *)&local_100.func,(int)builder.wasm + 0x10);
          Literal::makeOne((Literal *)local_148,
                           (Type)((builder.wasm)->exports).
                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
          Literal::sub((Literal *)&local_88.func,(Literal *)&local_100.func,(Literal *)local_148);
          Literal::operator=((Literal *)
                             &((builder.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Literal *)&local_88.func);
          Literal::~Literal((Literal *)&local_88.func);
          Literal::~Literal((Literal *)local_148);
          this_00 = &local_100;
        }
        Literal::~Literal((Literal *)&this_00->func);
        return (Expression *)curr;
      }
      Literal::abs((Literal *)local_190,(int)builder.wasm + 0x10);
      uVar45 = Literal::getInteger((Literal *)local_190);
      pMVar46 = local_40;
      if (uVar45 == 0) {
        Literal::~Literal((Literal *)local_190);
      }
      else {
        Literal::~Literal((Literal *)local_190);
        if ((uVar45 & uVar45 - 1) == 0) goto LAB_009d7f28;
      }
    }
    local_f0._0_8_ =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)0x0;
    local_e0 = (pointer)0x0;
    pbStack_d8 = (pointer)CONCAT44(pbStack_d8._4_4_,1);
    local_100.i64 = 0;
    auVar9._4_4_ = uStack_694;
    auVar9._0_4_ = 0xf;
    auVar9._8_8_ = local_190;
    auVar9._16_8_ = &local_100;
    auVar9._24_8_ = local_680;
    auVar9._32_8_ = 0;
    local_190 = (undefined1  [8])&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                         )(auVar9 << 0x40));
    if (bVar39) {
LAB_009d8128:
      IVar43 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this);
      if (IVar43 == 1) {
        return (Expression *)local_38.id;
      }
    }
    else {
      local_138.i64 = 0;
      local_128.id = 0;
      pCStack_120 = (pointer)((ulong)pCStack_120 & 0xffffffff00000000);
      local_148 = (undefined1  [8])0x0;
      auVar10._4_4_ = uStack_66c;
      auVar10._0_4_ = 0x10;
      auVar10._8_8_ = local_1d8;
      auVar10._16_8_ = local_148;
      auVar10._24_8_ = local_658;
      auVar10._32_8_ = 0;
      local_1d8 = (undefined1  [8])&stack0xffffffffffffffc8;
      bVar39 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                           )(auVar10 << 0x40));
      if (bVar39) goto LAB_009d8128;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_78.submatchers.curr.data = 1;
      local_88.i64 = 0;
      auVar11._4_4_ = uStack_644;
      auVar11._0_4_ = 0xf;
      auVar11._8_8_ = &builder;
      auVar11._16_8_ = &local_88;
      auVar11._24_8_ = local_630;
      auVar11._32_8_ = 0;
      builder.wasm = (Module *)&stack0xffffffffffffffc8;
      bVar39 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           )(auVar11 << 0x40));
      if (bVar39) goto LAB_009d8128;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    auVar12._4_4_ = uStack_61c;
    auVar12._0_4_ = 0x28;
    auVar12._8_8_ = local_148;
    auVar12._16_8_ = &local_88;
    auVar12._24_8_ = local_608;
    auVar12._32_8_ = 0;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar12 << 0x40));
    if (bVar39) {
LAB_009d8243:
      IVar43 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this);
      if (IVar43 == 1) {
        UVar41 = WrapInt64;
        curr = (Binary *)local_38.id;
        goto LAB_009d7d43;
      }
    }
    else {
      local_f0._0_8_ =
           (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
            *)0x0;
      local_100.i64 = 0;
      local_e0 = (pointer)0x0;
      pbStack_d8 = (pointer)0x0;
      auVar13._4_4_ = uStack_5f4;
      auVar13._0_4_ = 0x29;
      auVar13._8_8_ = local_190;
      auVar13._16_8_ = &local_100;
      auVar13._24_8_ = local_5e0;
      auVar13._32_8_ = 0;
      local_190 = (undefined1  [8])&stack0xffffffffffffffc8;
      bVar39 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           )(auVar13 << 0x40));
      if (bVar39) goto LAB_009d8243;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    auVar14._4_4_ = uStack_5cc;
    auVar14._0_4_ = 0x15;
    auVar14._8_8_ = &local_100;
    auVar14._16_8_ = &local_88;
    auVar14._24_8_ = local_5b8;
    auVar14._32_8_ = 0;
    local_100.i64 = (int64_t)(Module *)&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar14 << 0x40));
    if ((bVar39) &&
       (IVar43 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this),
       IVar43 == 1)) goto LAB_009d7d25;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    auVar15._4_4_ = uStack_5a4;
    auVar15._0_4_ = 0x11;
    auVar15._8_8_ = &local_100;
    auVar15._16_8_ = &local_88;
    auVar15._24_8_ = local_590;
    auVar15._32_8_ = 0;
    local_100._0_8_ = (Module *)&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar15 << 0x40));
    if ((bVar39) &&
       (IVar43 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this),
       IVar43 == 1)) {
      UVar41 = Abstract::getUnary(type,EqZ);
      curr = (Binary *)Builder::makeUnary(&local_b8,UVar41,(Expression *)local_38.id);
      if (((Type *)(local_38.id + 8))->id != 3) {
        return (Expression *)curr;
      }
LAB_009d83b2:
      UVar41 = ExtendUInt32;
      goto LAB_009d7d43;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    auVar16._4_4_ = uStack_57c;
    auVar16._0_4_ = 0x10;
    auVar16._8_8_ = &local_100;
    auVar16._16_8_ = &local_88;
    auVar16._24_8_ = local_568;
    auVar16._32_8_ = 0;
    local_100._0_8_ = (Module *)&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar16 << 0x40));
    if ((bVar39) &&
       (IVar43 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this),
       IVar43 == 1)) {
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
      options = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).super_Pass.runner)->options;
      goto LAB_009d85f5;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    auVar17._4_4_ = uStack_554;
    auVar17._0_4_ = 0xf;
    auVar17._8_8_ = &local_100;
    auVar17._16_8_ = &local_88;
    auVar17._24_8_ = local_540;
    auVar17._32_8_ = 0;
    local_100._0_8_ = (Module *)&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar17 << 0x40));
    if (bVar39) {
      return (Expression *)local_38.id;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    auVar18._4_4_ = uStack_52c;
    auVar18._0_4_ = 0x10;
    auVar18._8_8_ = &local_100;
    auVar18._16_8_ = &local_88;
    auVar18._24_8_ = local_518;
    auVar18._32_8_ = 0;
    local_100._0_8_ = (Module *)&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar18 << 0x40));
    if (bVar39) {
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
      options = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).super_Pass.runner)->options;
      pMVar46 = local_40;
      goto LAB_009d85f5;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 9;
    local_f0._0_8_ = local_148;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    x_1 = (Expression *)this;
    local_f0._8_8_ = &local_88;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar39) {
      Literal::makeZero((Literal *)&local_88.func,type);
      pMVar46 = local_40;
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
LAB_009d7df4:
      Literal::~Literal((Literal *)&local_88.func);
      return (Expression *)pMVar46;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = CONCAT44(local_78.submatchers.curr.data._4_4_,0x80000000);
    local_88.i64 = 0;
    auVar19._4_4_ = uStack_504;
    auVar19._0_4_ = 3;
    auVar19._8_8_ = &local_100;
    auVar19._16_8_ = &local_88;
    auVar19._24_8_ = local_4f0;
    auVar19._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                         )(auVar19 << 0x40));
    if (bVar39) {
      curr->op = EqInt32;
      return (Expression *)curr;
    }
    if ((((this->
          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
          ).super_Pass.runner)->options).shrinkLevel == 0) {
      local_100.i64 = 0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_78.submatchers.curr.data = -0x8000000000000000;
      local_88.i64 = 0;
      auVar20._4_4_ = uStack_4dc;
      auVar20._0_4_ = 0x1c;
      auVar20._8_8_ = &local_100;
      auVar20._16_8_ = &local_88;
      auVar20._24_8_ = local_4c8;
      auVar20._32_8_ = 0;
      bVar39 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           )(auVar20 << 0x40));
      if (bVar39) {
        curr->op = EqInt64;
        (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
        goto LAB_009d83b2;
      }
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 0x17;
    local_f0._0_8_ = local_148;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    x_1 = (Expression *)this;
    local_f0._8_8_ = &local_88;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar39) {
      Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      goto LAB_009d8818;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    auVar21._4_4_ = uStack_4b4;
    auVar21._0_4_ = 0x19;
    auVar21._8_8_ = &local_100;
    auVar21._16_8_ = &local_88;
    auVar21._24_8_ = local_4a0;
    auVar21._32_8_ = 0;
    local_100.i64 = (int64_t)(Module *)&stack0xffffffffffffffc8;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar21 << 0x40));
    if (bVar39) {
      Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
LAB_009d895f:
      Literal::~Literal((Literal *)&local_88.func);
      ((Type *)&(local_40->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->id = 2;
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
      options = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).super_Pass.runner)->options;
      pMVar46 = local_40;
LAB_009d85f5:
      pMVar46 = (Module *)
                wasm::getDroppedChildrenAndAppend
                          ((Expression *)curr,wasm,options,(Expression *)pMVar46,NoticeParentEffects
                          );
      return (Expression *)pMVar46;
    }
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    auVar22._4_4_ = uStack_48c;
    auVar22._0_4_ = 0x1b;
    auVar22._8_8_ = &local_100;
    auVar22._16_8_ = &local_88;
    auVar22._24_8_ = local_478;
    auVar22._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar22 << 0x40));
    if (bVar39) {
      Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      goto LAB_009d895f;
    }
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 0x1d;
    local_f0._0_8_ = local_148;
    local_f0._8_8_ = &local_88;
    x_1 = (Expression *)this;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar39) {
      Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      goto LAB_009d8818;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    auVar23._4_4_ = uStack_464;
    auVar23._0_4_ = 0x17;
    auVar23._8_8_ = &local_100;
    auVar23._16_8_ = &local_88;
    auVar23._24_8_ = local_450;
    auVar23._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar23 << 0x40));
    if (bVar39) {
LAB_009d8a8b:
      OVar47 = Ne;
LAB_009d8b15:
      BVar42 = Abstract::getBinary(type,OVar47);
      curr->op = BVar42;
      return (Expression *)curr;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    auVar24._4_4_ = uStack_43c;
    auVar24._0_4_ = 0x19;
    auVar24._8_8_ = &local_100;
    auVar24._16_8_ = &local_88;
    auVar24._24_8_ = local_428;
    auVar24._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar24 << 0x40));
    if (bVar39) {
LAB_009d8b09:
      OVar47 = Eq;
      goto LAB_009d8b15;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    auVar25._4_4_ = uStack_414;
    auVar25._0_4_ = 0x1b;
    auVar25._8_8_ = &local_100;
    auVar25._16_8_ = &local_88;
    auVar25._24_8_ = local_400;
    auVar25._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar25 << 0x40));
    if (bVar39) goto LAB_009d8a8b;
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    auVar26._4_4_ = uStack_3ec;
    auVar26._0_4_ = 0x1d;
    auVar26._8_8_ = &local_100;
    auVar26._16_8_ = &local_88;
    auVar26._24_8_ = local_3d8;
    auVar26._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar26 << 0x40));
    if (bVar39) goto LAB_009d8b09;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    local_100.i64 = 0;
    local_100._8_4_ = 0x16;
    local_f0._0_8_ = local_148;
    local_f0._8_8_ = &local_88;
    x_1 = (Expression *)this;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMin
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39)) {
      Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
LAB_009d8818:
      Literal::~Literal((Literal *)&local_88.func);
      ((Type *)&(local_40->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->id = 2;
      return (Expression *)local_40;
    }
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    local_100.i64 = 0;
    local_100._8_4_ = 0x18;
    local_f0._0_8_ = local_148;
    local_f0._8_8_ = &local_88;
    x_1 = (Expression *)this;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMax
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39)) {
      Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      goto LAB_009d8818;
    }
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    local_100.i64 = 0;
    local_100._8_4_ = 0x1a;
    local_f0._0_8_ = local_148;
    local_f0._8_8_ = &local_88;
    x_1 = (Expression *)this;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMax
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39)) {
      Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      goto LAB_009d8818;
    }
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    local_100.i64 = 0;
    local_100._8_4_ = 0x1c;
    local_f0._0_8_ = local_148;
    local_f0._8_8_ = &local_88;
    x_1 = (Expression *)this;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMin
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39)) {
      Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      goto LAB_009d8818;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    auVar27._4_4_ = uStack_3c4;
    auVar27._0_4_ = 0x16;
    auVar27._8_8_ = &local_100;
    auVar27._16_8_ = &local_88;
    auVar27._24_8_ = local_3b0;
    auVar27._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                         )(auVar27 << 0x40));
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMax
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39))
    goto LAB_009d8a8b;
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    auVar28._4_4_ = uStack_39c;
    auVar28._0_4_ = 0x18;
    auVar28._8_8_ = &local_100;
    auVar28._16_8_ = &local_88;
    auVar28._24_8_ = local_388;
    auVar28._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                         )(auVar28 << 0x40));
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMin
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39))
    goto LAB_009d8b09;
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    auVar29._4_4_ = uStack_374;
    auVar29._0_4_ = 0x1a;
    auVar29._8_8_ = &local_100;
    auVar29._16_8_ = &local_88;
    auVar29._24_8_ = local_360;
    auVar29._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                         )(auVar29 << 0x40));
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMin
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39))
    goto LAB_009d8a8b;
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_190;
    auVar30._4_4_ = uStack_34c;
    auVar30._0_4_ = 0x1c;
    auVar30._8_8_ = &local_100;
    auVar30._16_8_ = &local_88;
    auVar30._24_8_ = local_338;
    auVar30._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                         )(auVar30 << 0x40));
    if ((bVar39) &&
       (bVar39 = Literal::isSignedMax
                           ((((Literals *)((long)local_190 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems), bVar39))
    goto LAB_009d8b09;
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    auVar31._4_4_ = uStack_324;
    auVar31._0_4_ = 5;
    auVar31._8_8_ = &local_100;
    auVar31._16_8_ = &local_88;
    auVar31._24_8_ = local_310;
    auVar31._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar31 << 0x40));
    if (bVar39) {
      Literal::makeZero((Literal *)&local_88.func,type);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_88.func);
      BVar42 = Abstract::getBinary(type,Sub);
      curr->op = BVar42;
      curr->left = (Expression *)local_40;
LAB_009d9509:
      curr->right = (Expression *)local_38.id;
      return (Expression *)curr;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    local_190 = (undefined1  [8])local_1d8;
    local_148 = (undefined1  [8])0x0;
    x_1 = (Expression *)CONCAT44(x_1._4_4_,10);
    local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_88;
    local_138.func.super_IString.str._M_str = local_190;
    local_f0._0_8_ = (pointer)0x0;
    local_e0 = (pointer)0x0;
    pbStack_d8 = (pointer)0xffffffffffffffff;
    local_100.i64 = 0;
    auVar32._4_4_ = uStack_2fc;
    auVar32._0_4_ = 0x11;
    auVar32._8_8_ = local_148;
    auVar32._16_8_ = &local_100;
    auVar32._24_8_ = local_2e8;
    auVar32._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar32 << 0x40));
    if ((bVar39) &&
       ((((this->
          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
          ).super_Pass.runner)->options).targetJS == false)) {
      BVar42 = Abstract::getBinary(type,RotL);
      curr->op = BVar42;
      Literal::makeFromInt32((Literal *)&local_88.func,-2,type);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_88.func);
      curr->left = (Expression *)local_40;
      local_38.id = (uintptr_t)local_1d8;
      goto LAB_009d9509;
    }
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_148;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0x4000000000000000;
    local_88.i64 = 0;
    auVar33._4_4_ = uStack_2d4;
    auVar33._0_4_ = 5;
    auVar33._8_8_ = &local_100;
    auVar33._16_8_ = &local_88;
    auVar33._24_8_ = local_2c0;
    auVar33._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                         )(auVar33 << 0x40));
    if ((bVar39) &&
       ((IVar3 = *(Id *)&(((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            *)local_148)->
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start, IVar3 == LocalGetId ||
        (IVar3 == GlobalGetId)))) {
      BVar42 = Abstract::getBinary(type,Add);
      curr->op = BVar42;
      iVar44 = ExpressionManipulator::copy
                         ((EVP_PKEY_CTX *)local_148,
                          (EVP_PKEY_CTX *)
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .
                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          .currModule);
      local_38.id = CONCAT44(extraout_var,iVar44);
      goto LAB_009d9509;
    }
    if (this->fastMath == true) {
      local_100.i64 = 0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::ExactKind<long>_> *)local_148;
      local_88.i64 = 0;
      auVar34._4_4_ = uStack_2ac;
      auVar34._0_4_ = 3;
      auVar34._8_8_ = &local_100;
      auVar34._16_8_ = &local_88;
      auVar34._24_8_ = local_298;
      auVar34._32_8_ = 0;
      bVar39 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                           )(auVar34 << 0x40));
      if ((((bVar39) && ((double)local_148 == 0.0)) && (!NAN((double)local_148))) &&
         ((long)local_148 < 0)) {
        return (Expression *)(Module *)curr->left;
      }
    }
    builder.wasm = (Module *)&stack0xffffffffffffffc8;
    local_190 = (undefined1  [8])0x0;
    c_1 = (Const *)CONCAT44(c_1._4_4_,1);
    local_180.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&builder;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.i64 = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 5;
    local_f0._0_8_ = local_190;
    local_f0._8_8_ = &local_88;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar39) {
LAB_009d9497:
      ppuVar48 = &(local_40->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      Literal::neg((Literal *)&local_88.func,(Literal *)ppuVar48);
      Literal::operator=((Literal *)ppuVar48,(Literal *)&local_88.func);
LAB_009d7d6a:
      Literal::~Literal((Literal *)&local_88.func);
      curr->left = (Expression *)local_38.id;
      return (Expression *)curr;
    }
    inner = (Binary *)&stack0xffffffffffffffc8;
    local_1d8 = (undefined1  [8])0x0;
    x = (Expression *)CONCAT44(x._4_4_,1);
    local_1c8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&inner;
    local_f0._0_8_ =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)0x0;
    local_e0 = (pointer)0x0;
    local_100.i64 = 0;
    local_148 = (undefined1  [8])0x0;
    x_1 = (Expression *)CONCAT44(x_1._4_4_,7);
    local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1d8;
    local_138.func.super_IString.str._M_str = (char *)&local_100;
    bVar39 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                        *)local_148,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar39) goto LAB_009d9497;
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -0x4010000000000000;
    local_88.i64 = 0;
    auVar35._4_4_ = uStack_284;
    auVar35._0_4_ = 5;
    auVar35._8_8_ = &local_100;
    auVar35._16_8_ = &local_88;
    auVar35._24_8_ = local_270;
    auVar35._32_8_ = 0;
    bVar39 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                         )(auVar35 << 0x40));
    if (!bVar39) {
      local_190 = (undefined1  [8])&stack0xffffffffffffffc8;
      local_88.i64 = 0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78._8_4_ = 1;
      auVar36._4_4_ = uStack_25c;
      auVar36._0_4_ = 5;
      auVar36._8_8_ = local_190;
      auVar36._16_8_ = &local_88;
      auVar36._24_8_ = local_248;
      auVar36._32_8_ = 0;
      bVar39 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                           )(auVar36 << 0x40));
      if (!bVar39) {
        local_1d8 = (undefined1  [8])&stack0xffffffffffffffc8;
        local_100.i64 = 0;
        local_f0._0_8_ =
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              *)0x0;
        local_f0._8_4_ = 1;
        auVar37._4_4_ = uStack_234;
        auVar37._0_4_ = 7;
        auVar37._8_8_ = local_1d8;
        auVar37._16_8_ = &local_100;
        auVar37._24_8_ = local_220;
        auVar37._32_8_ = 0;
        bVar39 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                             )(auVar37 << 0x40));
        if (!bVar39) {
          builder.wasm = (Module *)&stack0xffffffffffffffc8;
          local_148 = (undefined1  [8])0x0;
          local_138.i64 = 0;
          local_138._8_4_ = 1;
          auVar38._4_4_ = uStack_20c;
          auVar38._0_4_ = 6;
          auVar38._8_8_ = &builder;
          auVar38._16_8_ = (element_type *)local_148;
          auVar38._24_8_ = local_1f8;
          auVar38._32_8_ = 0;
          bVar39 = Match::
                   matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                             ((Expression *)curr,
                              (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                               )(auVar38 << 0x40));
          if (!bVar39) goto LAB_009d974f;
        }
      }
      if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id &
          0xfffffffffffffffe) == 2) {
        return (Expression *)local_38.id;
      }
      if (this->fastMath == true) {
        return (Expression *)local_38.id;
      }
LAB_009d974f:
      local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1d8;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      matcher._8_8_ = uStack_748;
      matcher.binder = (matched_t<wasm::Binary_*> *)local_190;
      matcher.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_> *)0x0;
      matcher.submatchers.curr._8_8_ = uStack_738;
      matcher.submatchers.next.curr =
           (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)&local_100;
      matcher.submatchers.next.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
            *)&local_88;
      matcher.submatchers.next.next._8_8_ = local_720;
      local_100.func.super_IString.str._M_str = (char *)this;
      local_88.i64 = (int64_t)(element_type *)local_148;
      bVar39 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                         ((Expression *)curr,matcher);
      if (((bVar39) &&
          (dVar49 = Literal::getFloat((((Literals *)((long)local_148 + 8))->
                                      super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems),
          NAN(dVar49))) &&
         (BVar42 = (((Literals *)((long)local_190 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   fixed._M_elems[0].field_0.i32,
         BVar40 = Abstract::getBinary((Type)(((Literals *)((long)local_1d8 + 8))->
                                            super_SmallVector<wasm::Literal,_1UL>).usedFixed,
                                      CopySign), BVar42 != BVar40)) {
        bVar39 = Binary::isRelational((Binary *)local_190);
        if (bVar39) {
          (((Literals *)((long)local_148 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 2
          ;
          BVar42 = (((Literals *)((long)local_190 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   fixed._M_elems[0].field_0.i32;
          BVar40 = Abstract::getBinary((Type)(((Literals *)((long)local_1d8 + 8))->
                                             super_SmallVector<wasm::Literal,_1UL>).usedFixed,Ne);
          if (BVar42 == BVar40) {
            Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
            Literal::operator=((((Literals *)((long)local_148 + 8))->
                               super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                               (Literal *)&local_88.func);
          }
          else {
            Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
            Literal::operator=((((Literals *)((long)local_148 + 8))->
                               super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                               (Literal *)&local_88.func);
          }
        }
        else {
          Literal::standardizeNaN
                    ((Literal *)&local_88.func,
                     (((Literals *)((long)local_148 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     fixed._M_elems);
          Literal::operator=((((Literals *)((long)local_148 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                             (Literal *)&local_88.func);
        }
        Literal::~Literal((Literal *)&local_88.func);
        return (Expression *)local_148;
      }
      return (Expression *)(Module *)0x0;
    }
    if (this->fastMath != true) {
      BVar42 = Abstract::getBinary(type,Sub);
      curr->op = BVar42;
      Literal::makeZero((Literal *)&local_100.func,type);
      Literal::neg((Literal *)&local_88.func,(Literal *)&local_100.func);
      Literal::operator=((Literal *)
                         &(local_40->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_100.func);
      uVar1 = curr->left;
      uVar2 = curr->right;
      auVar50._8_4_ = (int)uVar1;
      auVar50._0_8_ = uVar2;
      auVar50._12_4_ = (int)((ulong)uVar1 >> 0x20);
      curr->left = (Expression *)uVar2;
      curr->right = (Expression *)auVar50._8_8_;
      return (Expression *)curr;
    }
    OVar47 = Neg;
  }
  UVar41 = Abstract::getUnary(type,OVar47);
  curr = (Binary *)local_38.id;
LAB_009d7d43:
  pMVar46 = (Module *)Builder::makeUnary(&local_b8,UVar41,(Expression *)curr);
  return (Expression *)pMVar46;
}

Assistant:

Expression* optimizeWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    Expression* left;
    auto* right = curr->right->cast<Const>();
    auto type = curr->right->type;

    // Operations on zero
    if (matches(curr, binary(Shl, any(&left), ival(0))) ||
        matches(curr, binary(ShrU, any(&left), ival(0))) ||
        matches(curr, binary(ShrS, any(&left), ival(0))) ||
        matches(curr, binary(Or, any(&left), ival(0))) ||
        matches(curr, binary(Xor, any(&left), ival(0)))) {
      return left;
    }
    if (matches(curr, binary(Mul, pure(&left), ival(0))) ||
        matches(curr, binary(And, pure(&left), ival(0)))) {
      return right;
    }
    // -x * C   ==>    x * -C,   if  shrinkLevel != 0  or  C != C_pot
    // -x * C   ==>   -(x * C),  otherwise
    //    where  x, C  are integers
    Binary* inner;
    if (matches(
          curr,
          binary(Mul, binary(&inner, Sub, ival(0), any(&left)), ival()))) {
      if (getPassOptions().shrinkLevel != 0 ||
          !Bits::isPowerOf2(right->value.getInteger())) {
        right->value = right->value.neg();
        curr->left = left;
        return curr;
      } else {
        curr->left = left;
        Const* zero = inner->left->cast<Const>();
        return builder.makeBinary(inner->op, zero, curr);
      }
    }
    // x == 0   ==>   eqz x
    if (matches(curr, binary(Eq, any(&left), ival(0)))) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // Operations on one
    // (signed)x % 1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // (signed)x % C_pot != 0   ==>  (x & (abs(C_pot) - 1)) != 0
    {
      Const* c;
      Binary* inner;
      if (matches(curr,
                  binary(Ne, binary(&inner, RemS, any(), ival(&c)), ival(0))) &&
          (c->value.isSignedMin() ||
           Bits::isPowerOf2(c->value.abs().getInteger()))) {
        inner->op = Abstract::getBinary(c->type, And);
        if (c->value.isSignedMin()) {
          c->value = Literal::makeSignedMax(c->type);
        } else {
          c->value = c->value.abs().sub(Literal::makeOne(c->type));
        }
        return curr;
      }
    }
    // i32(bool(x)) == 1  ==>  i32(bool(x))
    // i32(bool(x)) != 0  ==>  i32(bool(x))
    // i32(bool(x)) & 1   ==>  i32(bool(x))
    // i64(bool(x)) & 1   ==>  i64(bool(x))
    if ((matches(curr, binary(EqInt32, any(&left), i32(1))) ||
         matches(curr, binary(NeInt32, any(&left), i32(0))) ||
         matches(curr, binary(And, any(&left), ival(1)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return left;
    }
    // i64(bool(x)) == 1  ==>  i32(bool(x))
    // i64(bool(x)) != 0  ==>  i32(bool(x))
    if ((matches(curr, binary(EqInt64, any(&left), i64(1))) ||
         matches(curr, binary(NeInt64, any(&left), i64(0)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(WrapInt64, left);
    }
    // bool(x) != 1  ==>  !bool(x)
    if (matches(curr, binary(Ne, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // bool(x)  ^ 1  ==>  !bool(x)
    if (matches(curr, binary(Xor, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      auto* result = builder.makeUnary(Abstract::getUnary(type, EqZ), left);
      if (left->type == Type::i64) {
        // Xor's result is also an i64 in this case, but EqZ returns i32, so we
        // must expand it so that we keep returning the same value as before.
        // This means we replace a xor and a const with a xor and an extend,
        // which is still smaller (the const is 2 bytes, the extend just 1), and
        // also the extend may be removed by further work.
        result = builder.makeUnary(ExtendUInt32, result);
      }
      return result;
    }
    // bool(x) | 1  ==>  1
    if (matches(curr, binary(Or, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return getDroppedChildrenAndAppend(curr, right);
    }

    // Operations on all 1s
    // x & -1   ==>   x
    if (matches(curr, binary(And, any(&left), ival(-1)))) {
      return left;
    }
    // x | -1   ==>   -1
    if (matches(curr, binary(Or, any(&left), ival(-1)))) {
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (signed)x % -1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // i32(x) / i32.min_s   ==>   x == i32.min_s
    if (matches(
          curr,
          binary(DivSInt32, any(), i32(std::numeric_limits<int32_t>::min())))) {
      curr->op = EqInt32;
      return curr;
    }
    // i64(x) / i64.min_s   ==>   i64(x == i64.min_s)
    // only for zero shrink level
    if (getPassOptions().shrinkLevel == 0 &&
        matches(
          curr,
          binary(DivSInt64, any(), i64(std::numeric_limits<int64_t>::min())))) {
      curr->op = EqInt64;
      curr->type = Type::i32;
      return builder.makeUnary(ExtendUInt32, curr);
    }
    // (unsigned)x < 0   ==>   i32(0)
    if (matches(curr, binary(LtU, pure(&left), ival(0)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x <= -1  ==>   i32(1)
    if (matches(curr, binary(LeU, any(&left), ival(-1)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x > -1   ==>   i32(0)
    if (matches(curr, binary(GtU, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x >= 0   ==>   i32(1)
    if (matches(curr, binary(GeU, pure(&left), ival(0)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x < -1   ==>   x != -1
    // Friendlier to JS emitting as we don't need to write an unsigned -1 value
    // which is large.
    if (matches(curr, binary(LtU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x <= 0   ==>   x == 0
    if (matches(curr, binary(LeU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    // (unsigned)x > 0   ==>   x != 0
    if (matches(curr, binary(GtU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x >= -1  ==>   x == -1
    if (matches(curr, binary(GeU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    {
      Const* c;
      // (signed)x < (i32|i64).min_s   ==>   i32(0)
      if (matches(curr, binary(LtS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x <= (i32|i64).max_s   ==>   i32(1)
      if (matches(curr, binary(LeS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x > (i32|i64).max_s   ==>   i32(0)
      if (matches(curr, binary(GtS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x >= (i32|i64).min_s   ==>   i32(1)
      if (matches(curr, binary(GeS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x < (i32|i64).max_s   ==>   x != (i32|i64).max_s
      if (matches(curr, binary(LtS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x <= (i32|i64).min_s   ==>   x == (i32|i64).min_s
      if (matches(curr, binary(LeS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
      // (signed)x > (i32|i64).min_s   ==>   x != (i32|i64).min_s
      if (matches(curr, binary(GtS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x >= (i32|i64).max_s   ==>   x == (i32|i64).max_s
      if (matches(curr, binary(GeS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
    }
    // x * -1   ==>   0 - x
    if (matches(curr, binary(Mul, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      curr->op = Abstract::getBinary(type, Sub);
      curr->left = right;
      curr->right = left;
      return curr;
    }
    {
      // ~(1 << x) aka (1 << x) ^ -1  ==>  rotl(-2, x)
      Expression* x;
      // Note that we avoid this in JS mode, as emitting a rotation would
      // require lowering that rotation for JS in another cycle of work.
      if (matches(curr, binary(Xor, binary(Shl, ival(1), any(&x)), ival(-1))) &&
          !getPassOptions().targetJS) {
        curr->op = Abstract::getBinary(type, RotL);
        right->value = Literal::makeFromInt32(-2, type);
        curr->left = right;
        curr->right = x;
        return curr;
      }
    }
    {
      // x * 2.0  ==>  x + x
      // but we apply this only for simple expressions like
      // local.get and global.get for avoid using extra local
      // variable.
      Expression* x;
      if (matches(curr, binary(Mul, any(&x), fval(2.0))) &&
          (x->is<LocalGet>() || x->is<GlobalGet>())) {
        curr->op = Abstract::getBinary(type, Abstract::Add);
        curr->right = ExpressionManipulator::copy(x, *getModule());
        return curr;
      }
    }
    {
      // x + (-0.0)   ==>   x
      double value;
      if (fastMath && matches(curr, binary(Add, any(), fval(&value))) &&
          value == 0.0 && std::signbit(value)) {
        return curr->left;
      }
    }
    // -x * fval(C)   ==>   x * -C
    // -x / fval(C)   ==>   x / -C
    if (matches(curr, binary(Mul, unary(Neg, any(&left)), fval())) ||
        matches(curr, binary(DivS, unary(Neg, any(&left)), fval()))) {
      right->value = right->value.neg();
      curr->left = left;
      return curr;
    }
    // x * -1.0   ==>
    //       -x,  if fastMath == true
    // -0.0 - x,  if fastMath == false
    if (matches(curr, binary(Mul, any(), fval(-1.0)))) {
      if (fastMath) {
        return builder.makeUnary(Abstract::getUnary(type, Neg), left);
      }
      // x * -1.0   ==>  -0.0 - x
      curr->op = Abstract::getBinary(type, Sub);
      right->value = Literal::makeZero(type).neg();
      std::swap(curr->left, curr->right);
      return curr;
    }
    if (matches(curr, binary(Mul, any(&left), constant(1))) ||
        matches(curr, binary(DivS, any(&left), constant(1))) ||
        matches(curr, binary(DivU, any(&left), constant(1)))) {
      if (curr->type.isInteger() || fastMath) {
        return left;
      }
    }
    {
      //   x !=  NaN   ==>   1
      //   x <=> NaN   ==>   0
      //   x op  NaN'  ==>   NaN',  iff `op` != `copysign` and `x` != C
      Const* c;
      Binary* bin;
      Expression* x;
      if (matches(curr, binary(&bin, pure(&x), fval(&c))) &&
          std::isnan(c->value.getFloat()) &&
          bin->op != getBinary(x->type, CopySign)) {
        if (bin->isRelational()) {
          // reuse "c" (nan) constant
          c->type = Type::i32;
          if (bin->op == getBinary(x->type, Ne)) {
            // x != NaN  ==>  1
            c->value = Literal::makeOne(Type::i32);
          } else {
            // x == NaN,
            // x >  NaN,
            // x <= NaN
            // x .. NaN  ==>  0
            c->value = Literal::makeZero(Type::i32);
          }
          return c;
        }
        // propagate NaN of RHS but canonicalize it
        c->value = Literal::standardizeNaN(c->value);
        return c;
      }
    }
    return nullptr;
  }